

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O2

VerifyError * __thiscall
bssl::CertPathBuilderResultPath::GetVerifyError
          (VerifyError *__return_storage_ptr__,CertPathBuilderResultPath *this)

{
  CertPathErrors *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StatusCode code;
  bool bVar2;
  ParsedCertificate *pPVar3;
  _Storage<const_void_*,_true> _Var4;
  string *diagnostic_00;
  optional<const_void_*> oVar5;
  string diagnostic;
  ptrdiff_t depth;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  this_00 = &this->errors;
  CertPathErrors::ToDebugString_abi_cxx11_(&diagnostic,this_00,&this->certs);
  bVar2 = CertPathErrors::ContainsHighSeverityErrors(this_00);
  if (bVar2) {
    bVar2 = CertPathErrors::ContainsError(this_00,"Internal error");
    if ((bVar2) || (bVar2 = CertPathErrors::ContainsError(this_00,"Chain is empty"), bVar2)) {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
        local_1f8.field_2._8_8_ = diagnostic.field_2._8_8_;
      }
      else {
        local_1f8._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
      }
      local_1f8._M_string_length = diagnostic._M_string_length;
      diagnostic._M_string_length = 0;
      diagnostic.field_2._M_local_buf[0] = '\0';
      diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
      VerifyError::VerifyError(__return_storage_ptr__,VERIFICATION_FAILURE,-1,&local_1f8);
      diagnostic_00 = &local_1f8;
    }
    else {
      bVar2 = CertPathErrors::ContainsError(this_00,"Deadline exceeded");
      if (bVar2) {
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
          local_218.field_2._8_8_ = diagnostic.field_2._8_8_;
        }
        else {
          local_218._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
        }
        local_218._M_string_length = diagnostic._M_string_length;
        diagnostic._M_string_length = 0;
        diagnostic.field_2._M_local_buf[0] = '\0';
        diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
        VerifyError::VerifyError(__return_storage_ptr__,PATH_DEADLINE_EXCEEDED,-1,&local_218);
        diagnostic_00 = &local_218;
      }
      else {
        bVar2 = CertPathErrors::ContainsError(this_00,"Iteration limit exceeded");
        if (bVar2) {
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
            local_238.field_2._8_8_ = diagnostic.field_2._8_8_;
          }
          else {
            local_238._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
          }
          local_238._M_string_length = diagnostic._M_string_length;
          diagnostic._M_string_length = 0;
          diagnostic.field_2._M_local_buf[0] = '\0';
          diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
          VerifyError::VerifyError
                    (__return_storage_ptr__,PATH_ITERATION_COUNT_EXCEEDED,-1,&local_238);
          diagnostic_00 = &local_238;
        }
        else {
          bVar2 = CertPathErrors::ContainsError(this_00,"Depth limit exceeded");
          if (bVar2) {
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
              local_258.field_2._8_8_ = diagnostic.field_2._8_8_;
            }
            else {
              local_258._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
            }
            local_258._M_string_length = diagnostic._M_string_length;
            diagnostic._M_string_length = 0;
            diagnostic.field_2._M_local_buf[0] = '\0';
            diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
            VerifyError::VerifyError(__return_storage_ptr__,PATH_DEPTH_LIMIT_REACHED,-1,&local_258);
            diagnostic_00 = &local_258;
          }
          else {
            depth = -1;
            oVar5 = CertPathErrors::FindSingleHighSeverityError(this_00,&depth);
            _Var4 = oVar5.super__Optional_base<const_void_*,_true,_true>._M_payload.
                    super__Optional_payload_base<const_void_*>._M_payload;
            if (((undefined1  [16])
                 oVar5.super__Optional_base<const_void_*,_true,_true>._M_payload.
                 super__Optional_payload_base<const_void_*> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) {
              local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_38.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_38._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_38;
              local_38._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError(__return_storage_ptr__,PATH_MULTIPLE_ERRORS,-1,diagnostic_00)
              ;
            }
            else if ((char *)_Var4._M_value == "Time is after notAfter") {
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_58.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_58._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_58;
              local_58._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_EXPIRED,depth,diagnostic_00);
            }
            else if ((char *)_Var4._M_value == "Time is before notBefore") {
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_78.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_78._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_78;
              local_78._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_NOT_YET_VALID,depth,diagnostic_00);
            }
            else if (((((char *)_Var4._M_value == "Distrusted by trust store") ||
                      ((char *)_Var4._M_value == "Certificate is not a trust anchor")) ||
                     ((char *)_Var4._M_value == "max_path_length reached")) ||
                    (((char *)_Var4._M_value == "subject does not match issuer" ||
                     ((char *)_Var4._M_value == "No matching issuer found")))) {
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_98.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_98._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_98;
              local_98._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError(__return_storage_ptr__,PATH_NOT_FOUND,depth,diagnostic_00);
            }
            else if ((char *)_Var4._M_value == "VerifySignedData failed") {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_b8.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_b8._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_b8;
              local_b8._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_INVALID_SIGNATURE,depth,diagnostic_00);
            }
            else if ((char *)_Var4._M_value == "Unacceptable signature algorithm") {
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_d8.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_d8._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_d8;
              local_d8._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_UNSUPPORTED_SIGNATURE_ALGORITHM,depth,
                         diagnostic_00);
            }
            else if ((char *)_Var4._M_value == "Unacceptable public key") {
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_f8.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_f8._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_f8;
              local_f8._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_UNSUPPORTED_KEY,depth,diagnostic_00);
            }
            else if ((((char *)_Var4._M_value ==
                       "The extended key usage does not include server auth") ||
                     ((char *)_Var4._M_value ==
                      "The extended key usage does not include server auth but instead includes anyExtendeKeyUsage"
                     )) || (((char *)_Var4._M_value ==
                             "The extended key usage does not include client auth" ||
                            (((char *)_Var4._M_value ==
                              "The extended key usage does not include client auth but instead includes anyExtendedKeyUsage"
                             || ((char *)_Var4._M_value ==
                                 "The extended key usage does not include client auth or server auth"
                                )))))) {
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_118.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_118._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_118;
              local_118._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_NO_MATCHING_EKU,depth,diagnostic_00);
            }
            else if ((char *)_Var4._M_value == "Certificate is revoked") {
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_138.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_138._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_138;
              local_138._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_REVOKED,depth,diagnostic_00);
            }
            else if ((char *)_Var4._M_value == "Certificate lacks a revocation mechanism") {
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_158.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_158._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_158;
              local_158._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_NO_REVOCATION_MECHANISM,depth,
                         diagnostic_00);
            }
            else if ((char *)_Var4._M_value == "Unable to check revocation") {
              local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_178.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_178._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_178;
              local_178._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError
                        (__return_storage_ptr__,CERTIFICATE_UNABLE_TO_CHECK_REVOCATION,depth,
                         diagnostic_00);
            }
            else {
              code = CERTIFICATE_INVALID;
              if (depth < 0) {
                code = VERIFICATION_FAILURE;
              }
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)diagnostic._M_dataplus._M_p == &diagnostic.field_2) {
                local_198.field_2._8_8_ = diagnostic.field_2._8_8_;
              }
              else {
                local_198._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
              }
              diagnostic_00 = &local_198;
              local_198._M_string_length = diagnostic._M_string_length;
              diagnostic._M_string_length = 0;
              diagnostic.field_2._M_local_buf[0] = '\0';
              diagnostic._M_dataplus._M_p = (pointer)&diagnostic.field_2;
              VerifyError::VerifyError(__return_storage_ptr__,code,depth,diagnostic_00);
            }
          }
        }
      }
    }
  }
  else {
    pPVar3 = GetTrustedCert(this);
    paVar1 = &diagnostic.field_2;
    if (pPVar3 == (ParsedCertificate *)0x0) {
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)diagnostic._M_dataplus._M_p == paVar1) {
        local_1d8.field_2._8_8_ = diagnostic.field_2._8_8_;
      }
      else {
        local_1d8._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
      }
      local_1d8._M_string_length = diagnostic._M_string_length;
      diagnostic._M_string_length = 0;
      diagnostic.field_2._M_local_buf[0] = '\0';
      diagnostic._M_dataplus._M_p = (pointer)paVar1;
      VerifyError::VerifyError(__return_storage_ptr__,VERIFICATION_FAILURE,-1,&local_1d8);
      diagnostic_00 = &local_1d8;
    }
    else {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)diagnostic._M_dataplus._M_p == paVar1) {
        local_1b8.field_2._8_8_ = diagnostic.field_2._8_8_;
      }
      else {
        local_1b8._M_dataplus._M_p = diagnostic._M_dataplus._M_p;
      }
      local_1b8._M_string_length = diagnostic._M_string_length;
      diagnostic._M_string_length = 0;
      diagnostic.field_2._M_local_buf[0] = '\0';
      diagnostic._M_dataplus._M_p = (pointer)paVar1;
      VerifyError::VerifyError(__return_storage_ptr__,PATH_VERIFIED,0,&local_1b8);
      diagnostic_00 = &local_1b8;
    }
  }
  ::std::__cxx11::string::~string((string *)diagnostic_00);
  ::std::__cxx11::string::~string((string *)&diagnostic);
  return __return_storage_ptr__;
}

Assistant:

VerifyError CertPathBuilderResultPath::GetVerifyError() const {
  // Diagnostic string is always "everything" about the path.
  std::string diagnostic = errors.ToDebugString(certs);
  if (!errors.ContainsHighSeverityErrors()) {
    // TODO(bbe3): Having to check this after seems awkward: crbug.com/boringssl/713
    if (GetTrustedCert()) {
      return VerifyError(VerifyError::StatusCode::PATH_VERIFIED, 0,
                         std::move(diagnostic));
    } else {
      return VerifyError(VerifyError::StatusCode::VERIFICATION_FAILURE, -1,
                         std::move(diagnostic));
    }
  }

  // Check for the presence of things that amount to Internal errors in the
  // verification code. We deliberately prioritize this to not hide it in
  // multiple error cases.
  if (errors.ContainsError(cert_errors::kInternalError) ||
      errors.ContainsError(cert_errors::kChainIsEmpty)) {
    return VerifyError(VerifyError::StatusCode::VERIFICATION_FAILURE, -1,
                       std::move(diagnostic));
  }

  // Similarly, for the deadline and limit cases, there will often be other
  // errors that we probably do not care about, since path building was
  // aborted. Surface these errors instead of having them hidden in the multiple
  // error case.
  //
  // Normally callers should check for these in the path builder result before
  // calling this on a single path, but this is here in case they do not and
  // these errors are actually present on this path.
  if (errors.ContainsError(cert_errors::kDeadlineExceeded)) {
    return VerifyError(VerifyError::StatusCode::PATH_DEADLINE_EXCEEDED, -1,
                       std::move(diagnostic));
  }
  if (errors.ContainsError(cert_errors::kIterationLimitExceeded)) {
    return VerifyError(VerifyError::StatusCode::PATH_ITERATION_COUNT_EXCEEDED,
                       -1, std::move(diagnostic));
  }
  if (errors.ContainsError(cert_errors::kDepthLimitExceeded)) {
    return VerifyError(VerifyError::StatusCode::PATH_DEPTH_LIMIT_REACHED, -1,
                       std::move(diagnostic));
  }

  // If the chain has multiple high severity errors, indicate that.
  ptrdiff_t depth = -1;
  std::optional<CertErrorId> single_error =
      errors.FindSingleHighSeverityError(depth);
  if (!single_error.has_value()) {
    return VerifyError(VerifyError::StatusCode::PATH_MULTIPLE_ERRORS, -1,
                       std::move(diagnostic));
  }

  // Otherwise it has a single error, map it appropriately at the
  // depth it first occurs.
  if (single_error.value() == cert_errors::kValidityFailedNotAfter) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_EXPIRED, depth,
                       std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kValidityFailedNotBefore) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_NOT_YET_VALID,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kDistrustedByTrustStore ||
      single_error.value() == cert_errors::kCertIsNotTrustAnchor ||
      single_error.value() == cert_errors::kMaxPathLengthViolated ||
      single_error.value() == cert_errors::kSubjectDoesNotMatchIssuer ||
      single_error.value() == cert_errors::kNoIssuersFound) {
    return VerifyError(VerifyError::StatusCode::PATH_NOT_FOUND, depth,
                       std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kVerifySignedDataFailed) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_INVALID_SIGNATURE,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kUnacceptableSignatureAlgorithm) {
    return VerifyError(
        VerifyError::StatusCode::CERTIFICATE_UNSUPPORTED_SIGNATURE_ALGORITHM,
        depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kUnacceptablePublicKey) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_UNSUPPORTED_KEY,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kEkuLacksServerAuth ||
      single_error.value() == cert_errors::kEkuLacksServerAuthButHasAnyEKU ||
      single_error.value() == cert_errors::kEkuLacksClientAuth ||
      single_error.value() == cert_errors::kEkuLacksClientAuthButHasAnyEKU ||
      single_error.value() == cert_errors::kEkuLacksClientAuthOrServerAuth) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_NO_MATCHING_EKU,
                       depth, std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kCertificateRevoked) {
    return VerifyError(VerifyError::StatusCode::CERTIFICATE_REVOKED, depth,
                       std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kNoRevocationMechanism) {
    return VerifyError(
        VerifyError::StatusCode::CERTIFICATE_NO_REVOCATION_MECHANISM, depth,
        std::move(diagnostic));
  }
  if (single_error.value() == cert_errors::kUnableToCheckRevocation) {
    return VerifyError(
        VerifyError::StatusCode::CERTIFICATE_UNABLE_TO_CHECK_REVOCATION, depth,
        std::move(diagnostic));
  }
  // All other High severity errors map to CERTIFICATE_INVALID if associated
  // to a certificate, or VERIFICATION_FAILURE if not associated to a
  // certificate.
  return VerifyError((depth < 0) ? VerifyError::StatusCode::VERIFICATION_FAILURE
                                 : VerifyError::StatusCode::CERTIFICATE_INVALID,
                     depth, std::move(diagnostic));
}